

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void start_pass_fdctmgr(j_compress_ptr cinfo)

{
  double dVar1;
  int iVar2;
  J_DCT_METHOD JVar3;
  uint uVar4;
  jpeg_forward_dct *pjVar5;
  code *pcVar6;
  forward_DCT_ptr p_Var7;
  jpeg_error_mgr *pjVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  jpeg_component_info *pjVar16;
  JQUANT_TBL *pJVar17;
  
  pjVar16 = cinfo->comp_info;
  pjVar5 = cinfo->fdct;
  lVar13 = 0;
  iVar14 = 0;
  do {
    if (cinfo->num_components <= lVar13) {
      return;
    }
    iVar2 = pjVar16->DCT_h_scaled_size;
    iVar9 = iVar2 * 0x100 + pjVar16->DCT_v_scaled_size;
    if (iVar9 == 0x1010) {
      pcVar6 = jpeg_fdct_16x16;
LAB_001c7208:
      pjVar5[1].forward_DCT[lVar13 + -1] = pcVar6;
      iVar14 = 0;
    }
    else {
      if (iVar9 == 0x102) {
        pcVar6 = jpeg_fdct_1x2;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x201) {
        pcVar6 = jpeg_fdct_2x1;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x202) {
        pcVar6 = jpeg_fdct_2x2;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x204) {
        pcVar6 = jpeg_fdct_2x4;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x303) {
        pcVar6 = jpeg_fdct_3x3;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x306) {
        pcVar6 = jpeg_fdct_3x6;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x402) {
        pcVar6 = jpeg_fdct_4x2;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x404) {
        pcVar6 = jpeg_fdct_4x4;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x408) {
        pcVar6 = jpeg_fdct_4x8;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x505) {
        pcVar6 = jpeg_fdct_5x5;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x50a) {
        pcVar6 = jpeg_fdct_5x10;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x603) {
        pcVar6 = jpeg_fdct_6x3;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x606) {
        pcVar6 = jpeg_fdct_6x6;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x60c) {
        pcVar6 = jpeg_fdct_6x12;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x707) {
        pcVar6 = jpeg_fdct_7x7;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x70e) {
        pcVar6 = jpeg_fdct_7x14;
        goto LAB_001c7208;
      }
      if (iVar9 == 0x804) {
        pcVar6 = jpeg_fdct_8x4;
        goto LAB_001c7208;
      }
      if (iVar9 != 0x808) {
        if (iVar9 == 0x810) {
          pcVar6 = jpeg_fdct_8x16;
        }
        else if (iVar9 == 0x909) {
          pcVar6 = jpeg_fdct_9x9;
        }
        else if (iVar9 == 0xa05) {
          pcVar6 = jpeg_fdct_10x5;
        }
        else if (iVar9 == 0xa0a) {
          pcVar6 = jpeg_fdct_10x10;
        }
        else if (iVar9 == 0xb0b) {
          pcVar6 = jpeg_fdct_11x11;
        }
        else if (iVar9 == 0xc06) {
          pcVar6 = jpeg_fdct_12x6;
        }
        else if (iVar9 == 0xc0c) {
          pcVar6 = jpeg_fdct_12x12;
        }
        else if (iVar9 == 0xd0d) {
          pcVar6 = jpeg_fdct_13x13;
        }
        else if (iVar9 == 0xe07) {
          pcVar6 = jpeg_fdct_14x7;
        }
        else if (iVar9 == 0xe0e) {
          pcVar6 = jpeg_fdct_14x14;
        }
        else if (iVar9 == 0xf0f) {
          pcVar6 = jpeg_fdct_15x15;
        }
        else if (iVar9 == 0x1008) {
          pcVar6 = jpeg_fdct_16x8;
        }
        else {
          if (iVar9 != 0x101) {
            pjVar8 = cinfo->err;
            pjVar8->msg_code = 7;
            (pjVar8->msg_parm).i[0] = iVar2;
            (cinfo->err->msg_parm).i[1] = pjVar16->DCT_v_scaled_size;
            pjVar8 = cinfo->err;
            goto LAB_001c7458;
          }
          pcVar6 = jpeg_fdct_1x1;
        }
        goto LAB_001c7208;
      }
      JVar3 = cinfo->dct_method;
      if (JVar3 == JDCT_FLOAT) {
        pjVar5[2].forward_DCT[lVar13 + 2] = jpeg_fdct_float;
        iVar14 = 2;
      }
      else if (JVar3 == JDCT_IFAST) {
        pjVar5[1].forward_DCT[lVar13 + -1] = jpeg_fdct_ifast;
        iVar14 = 1;
      }
      else {
        if (JVar3 == JDCT_ISLOW) {
          pcVar6 = jpeg_fdct_islow;
          goto LAB_001c7208;
        }
        pjVar8 = cinfo->err;
        pjVar8->msg_code = 0x31;
LAB_001c7458:
        (*pjVar8->error_exit)((j_common_ptr)cinfo);
      }
    }
    uVar4 = pjVar16->quant_tbl_no;
    uVar15 = (ulong)uVar4;
    if ((3 < uVar15) || (pJVar17 = cinfo->quant_tbl_ptrs[uVar15], pJVar17 == (JQUANT_TBL *)0x0)) {
      uVar15 = (ulong)(int)uVar4;
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x36;
      (pjVar8->msg_parm).i[0] = uVar4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      pJVar17 = cinfo->quant_tbl_ptrs[uVar15];
    }
    if (iVar14 == 2) {
      p_Var7 = pjVar5[3].forward_DCT[uVar15 + 1];
      if (p_Var7 == (forward_DCT_ptr)0x0) {
        iVar14 = 2;
        p_Var7 = (forward_DCT_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
        pjVar5[3].forward_DCT[uVar15 + 1] = p_Var7;
      }
      lVar11 = 0;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        dVar1 = start_pass_fdctmgr::aanscalefactor[lVar10];
        lVar11 = (long)(int)lVar11;
        for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 8) {
          *(float *)(p_Var7 + lVar11 * 4) =
               (float)(1.0 / ((double)pJVar17->quantval[lVar11] * dVar1 *
                              *(double *)((long)start_pass_fdctmgr::aanscalefactor + lVar12) * 8.0))
          ;
          lVar11 = lVar11 + 1;
        }
      }
      pcVar6 = forward_DCT_float;
    }
    else {
      if (iVar14 == 1) {
        p_Var7 = pjVar5[1].forward_DCT[uVar15 + 9];
        if (p_Var7 == (forward_DCT_ptr)0x0) {
          iVar14 = 1;
          p_Var7 = (forward_DCT_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          pjVar5[1].forward_DCT[uVar15 + 9] = p_Var7;
        }
        for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 2) {
          *(int *)(p_Var7 + lVar10 * 2) =
               (int)((long)*(short *)((long)start_pass_fdctmgr::aanscales + lVar10) *
                     (ulong)*(ushort *)((long)pJVar17->quantval + lVar10) + 0x400 >> 0xb);
        }
      }
      else {
        p_Var7 = pjVar5[1].forward_DCT[uVar15 + 9];
        if (p_Var7 == (forward_DCT_ptr)0x0) {
          p_Var7 = (forward_DCT_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          pjVar5[1].forward_DCT[uVar15 + 9] = p_Var7;
        }
        for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 1) {
          *(uint *)(p_Var7 + lVar10 * 4) = (uint)pJVar17->quantval[lVar10] << 3;
        }
      }
      pcVar6 = forward_DCT;
    }
    pjVar5->forward_DCT[lVar13] = pcVar6;
    lVar13 = lVar13 + 1;
    pjVar16 = pjVar16 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass_fdctmgr (j_compress_ptr cinfo)
{
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  int ci, qtblno, i;
  jpeg_component_info *compptr;
  int method = 0;
  JQUANT_TBL * qtbl;
  DCTELEM * dtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper DCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef DCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      fdct->do_dct[ci] = jpeg_fdct_1x1;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_2x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      fdct->do_dct[ci] = jpeg_fdct_3x3;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_4x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      fdct->do_dct[ci] = jpeg_fdct_5x5;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_6x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      fdct->do_dct[ci] = jpeg_fdct_7x7;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      fdct->do_dct[ci] = jpeg_fdct_9x9;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      fdct->do_dct[ci] = jpeg_fdct_10x10;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      fdct->do_dct[ci] = jpeg_fdct_11x11;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      fdct->do_dct[ci] = jpeg_fdct_12x12;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      fdct->do_dct[ci] = jpeg_fdct_13x13;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      fdct->do_dct[ci] = jpeg_fdct_14x14;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      fdct->do_dct[ci] = jpeg_fdct_15x15;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      fdct->do_dct[ci] = jpeg_fdct_16x16;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      fdct->do_dct[ci] = jpeg_fdct_16x8;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      fdct->do_dct[ci] = jpeg_fdct_14x7;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_12x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      fdct->do_dct[ci] = jpeg_fdct_10x5;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_8x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      fdct->do_dct[ci] = jpeg_fdct_6x3;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_4x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      fdct->do_dct[ci] = jpeg_fdct_2x1;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      fdct->do_dct[ci] = jpeg_fdct_8x16;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      fdct->do_dct[ci] = jpeg_fdct_7x14;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      fdct->do_dct[ci] = jpeg_fdct_6x12;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      fdct->do_dct[ci] = jpeg_fdct_5x10;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      fdct->do_dct[ci] = jpeg_fdct_4x8;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_3x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_2x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_1x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	fdct->do_dct[ci] = jpeg_fdct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	fdct->do_dct[ci] = jpeg_fdct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	fdct->do_float_dct[ci] = jpeg_fdct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    qtblno = compptr->quant_tbl_no;
    /* Make sure specified quantization table is present */
    if (qtblno < 0 || qtblno >= NUM_QUANT_TBLS ||
	cinfo->quant_tbl_ptrs[qtblno] == NULL)
      ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, qtblno);
    qtbl = cinfo->quant_tbl_ptrs[qtblno];
    /* Compute divisors for this quant table */
    /* We may do this more than once for same table, but it's not a big deal */
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      /* For LL&M IDCT method, divisors are equal to raw quantization
       * coefficients multiplied by 8 (to counteract scaling).
       */
      if (fdct->divisors[qtblno] == NULL) {
	fdct->divisors[qtblno] = (DCTELEM *)
	  (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				      DCTSIZE2 * SIZEOF(DCTELEM));
      }
      dtbl = fdct->divisors[qtblno];
      for (i = 0; i < DCTSIZE2; i++) {
	dtbl[i] = ((DCTELEM) qtbl->quantval[i]) << 3;
      }
      fdct->pub.forward_DCT[ci] = forward_DCT;
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, divisors are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 8.
	 */
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	if (fdct->divisors[qtblno] == NULL) {
	  fdct->divisors[qtblno] = (DCTELEM *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					DCTSIZE2 * SIZEOF(DCTELEM));
	}
	dtbl = fdct->divisors[qtblno];
	for (i = 0; i < DCTSIZE2; i++) {
	  dtbl[i] = (DCTELEM)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-3);
	}
      }
      fdct->pub.forward_DCT[ci] = forward_DCT;
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, divisors are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 8.
	 * What's actually stored is 1/divisor so that the inner loop can
	 * use a multiplication rather than a division.
	 */
	FAST_FLOAT * fdtbl;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	if (fdct->float_divisors[qtblno] == NULL) {
	  fdct->float_divisors[qtblno] = (FAST_FLOAT *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					DCTSIZE2 * SIZEOF(FAST_FLOAT));
	}
	fdtbl = fdct->float_divisors[qtblno];
	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fdtbl[i] = (FAST_FLOAT)
	      (1.0 / (((double) qtbl->quantval[i] *
		       aanscalefactor[row] * aanscalefactor[col] * 8.0)));
	    i++;
	  }
	}
      }
      fdct->pub.forward_DCT[ci] = forward_DCT_float;
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}